

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::anon_unknown_2::ScanControlTest::~ScanControlTest(ScanControlTest *this)

{
  operator_delete(this);
  return;
}

Assistant:

int run() override {
		if (chipset.card_type < 3) {
			nva_wr32(cnum, 0x4006a4, 0x0f000111);
		} else if (chipset.card_type < 4) {
			nva_wr32(cnum, 0x4006a4, 0);
		} else {
			nva_wr32(cnum, 0x400720, 0);
		}
		for (auto &reg : pgraph_control_regs(chipset)) {
			if (reg->scan_test(cnum, rnd))
				res = HWTEST_RES_FAIL;
		}
		if (chipset.card_type < 4) {
			bitscan(0x400190, 0x11010103, 0);
			if (chipset.card_type >= 3) {
				bitscan(0x4006a4, 0x1, 0);
			}
		} else {
			bool is_nv5 = chipset.chipset >= 5;
			bool is_nv15p = nv04_pgraph_is_nv15p(&chipset);
			bool is_nv17p = nv04_pgraph_is_nv17p(&chipset);
			bool is_nv1720p = is_nv17p || chipset.card_type >= 0x20;
			if (chipset.card_type < 0x10) {
				nva_wr32(cnum, 0x400750, 0);
				nva_wr32(cnum, 0x400754, 0);
				bitscan(0x400750, 0x00000077, 0);
				bitscan(0x400754, is_nv5 ? 0x003fffff : 0x000fffff, 0);
				bitscan(0x400758, 0xffffffff, 0);
				bitscan(0x400720, 0x1, 0);
				for (int i = 0 ; i < 4; i++) {
					bitscan(0x400730 + i * 4, 0x00007fff, 0);
					bitscan(0x400740 + i * 4, 0xffffffff, 0);
				}
			} else {
				if (chipset.card_type < 0x40)
					bitscan(0x40077c, chipset.card_type >= 0x20 ? 0x0100ffff : is_nv15p ? 0x631fffff : 0x7100ffff, 0);
				if (is_nv17p) {
					nva_wr32(cnum, 0x400090, 0);
					bitscan(0x400a00, 0x1fff1fff, 0);
					bitscan(0x400a04, 0x1fff1fff, 0);
					bitscan(0x400a10, 0xdfff3fff, 0);
				}
				nva_wr32(cnum, 0x400760, 0);
				nva_wr32(cnum, 0x400764, 0);
				bitscan(0x400760, is_nv1720p ? 0x000000ff : 0x00000077, 0);
				if (chipset.card_type < 0x40)
					bitscan(0x400764, is_nv1720p ? 0x7ff71ffc : 0x3ff71ffc, 0);
				else
					bitscan(0x400764, 0x46071ffc, 0);
				bitscan(0x400768, 0xffffffff, 0);
				bitscan(0x40076c, 0xffffffff, 0);
				bitscan(0x400720, 0x1, 0);
				if (!is_nv1720p) {
					for (int i = 0 ; i < 4; i++) {
						bitscan(0x400730 + i * 4, 0x01171ffc, 0);
						bitscan(0x400740 + i * 4, 0xffffffff, 0);
						bitscan(0x400750 + i * 4, 0xffffffff, 0);
					}
				} else {
					for (int i = 0 ; i < 8; i++) {
						bitscan(0x4007a0 + i * 4, 0x00371ffc, 0);
						bitscan(0x4007c0 + i * 4, 0xffffffff, 0);
						bitscan(0x4007e0 + i * 4, 0xffffffff, 0);
					}
				}
				if (!is_nv15p) {
					bitscan(0x400f50, 0x00001fff, 0);
				} else if (chipset.card_type < 0x20) {
					bitscan(0x400f50, 0x00007ffc, 0);
				} else if (chipset.card_type < 0x30) {
					bitscan(0x400f50, 0x0001fffc, 0);
					if (!nv04_pgraph_is_nv25p(&chipset))
						bitscan(0x400750, 0x01ff1ffc, 0);
					else
						bitscan(0x400750, 0x03ff1ffc, 0);
				} else if (chipset.card_type < 0x40) {
					bitscan(0x400f50, 0x0003fffc, 0);
					bitscan(0x400750, 0x03ff7ffc, 0);
					bitscan(0x40075c, 1, 0);
				} else {
					// rip RDI :(
					bitscan(0x400f50, 0x1303fffc, 0);
				}
			}
		}
		return res;
	}